

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O2

void __thiscall
icu_63::double_conversion::Double::NormalizedBoundaries
          (Double *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  DiyFp DVar5;
  DiyFp DVar6;
  DiyFp local_40;
  
  DVar5 = AsDiyFp(this);
  uVar4 = DVar5.f_;
  local_40.f_ = uVar4 * 2 + 1;
  iVar1 = DVar5.e_ + -1;
  local_40.e_ = iVar1;
  DVar6 = DiyFp::Normalize(&local_40);
  iVar2 = DVar5.e_ + -2;
  lVar3 = uVar4 << 2;
  if ((this->d64_ & 0xfffffffffffff) != 0 || (this->d64_ & 0x7fe0000000000000) == 0) {
    iVar2 = iVar1;
    lVar3 = uVar4 * 2;
  }
  out_m_plus->f_ = DVar6.f_;
  out_m_plus->e_ = DVar6.e_;
  out_m_minus->f_ = lVar3 + -1 << ((char)iVar2 - (char)DVar6.e_ & 0x3fU);
  out_m_minus->e_ = DVar6.e_;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* out_m_minus, DiyFp* out_m_plus) const {
    ASSERT(value() > 0.0);
    DiyFp v = this->AsDiyFp();
    DiyFp m_plus = DiyFp::Normalize(DiyFp((v.f() << 1) + 1, v.e() - 1));
    DiyFp m_minus;
    if (LowerBoundaryIsCloser()) {
      m_minus = DiyFp((v.f() << 2) - 1, v.e() - 2);
    } else {
      m_minus = DiyFp((v.f() << 1) - 1, v.e() - 1);
    }
    m_minus.set_f(m_minus.f() << (m_minus.e() - m_plus.e()));
    m_minus.set_e(m_plus.e());
    *out_m_plus = m_plus;
    *out_m_minus = m_minus;
  }